

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  JsonParse *pParse;
  char *zPath;
  ulong uVar2;
  
  if (0 < argc) {
    pParse = jsonParseFuncArg(ctx,*argv,(uint)(argc != 1));
    if (pParse != (JsonParse *)0x0) {
      if (argc != 1) {
        uVar2 = 1;
        do {
          zPath = (char *)sqlite3ValueText(argv[uVar2],'\x01');
          if (zPath == (char *)0x0) goto LAB_001b7477;
          if (*zPath != '$') {
LAB_001b7440:
            jsonBadPathError(ctx,zPath);
            goto LAB_001b7477;
          }
          if (zPath[1] == '\0') goto LAB_001b7477;
          pParse->eEdit = '\x01';
          pParse->delta = 0;
          uVar1 = jsonLookupStep(pParse,0,zPath + 1,0);
          if (uVar1 != 0xfffffffe && 0xfffffffc < uVar1) {
            if (uVar1 == 0xfffffffd) goto LAB_001b7440;
            ctx->isError = 1;
            sqlite3VdbeMemSetStr
                      (ctx->pOut,"malformed JSON",-1,'\x01',
                       (_func_void_void_ptr *)0xffffffffffffffff);
            goto LAB_001b7477;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)argc != uVar2);
      }
      jsonReturnParse(ctx,pParse);
LAB_001b7477:
      jsonParseFree(pParse);
      return;
    }
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath = 0; /* Path of element to be removed */
  int i;                 /* Loop counter */
  u32 rc;                /* Subroutine return code */

  if( argc<1 ) return;
  p = jsonParseFuncArg(ctx, argv[0], argc>1 ? JSON_EDITABLE : 0);
  if( p==0 ) return;
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ){
      goto json_remove_done;
    }
    if( zPath[0]!='$' ){
      goto json_remove_patherror;
    }
    if( zPath[1]==0 ){
      /* json_remove(j,'$') returns NULL */
      goto json_remove_done;
    }
    p->eEdit = JEDIT_DEL;
    p->delta = 0;
    rc = jsonLookupStep(p, 0, zPath+1, 0);
    if( JSON_LOOKUP_ISERROR(rc) ){
      if( rc==JSON_LOOKUP_NOTFOUND ){
        continue;  /* No-op */
      }else if( rc==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      goto json_remove_done;
    }
  }
  jsonReturnParse(ctx, p);
  jsonParseFree(p);
  return;

json_remove_patherror:
  jsonBadPathError(ctx, zPath);

json_remove_done:
  jsonParseFree(p);
  return;
}